

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_uuencode.c
# Opt level: O3

void test_option_uuencode(void)

{
  wchar_t wVar1;
  size_t in_RAX;
  char *pcVar2;
  size_t s;
  
  s = in_RAX;
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_uuencode.c"
                      ,L'\x10',"f",L'Ƥ',L'\xffffffff',"a");
  wVar1 = systemf("%s -cf - -Z --uuencode f >archive.out 2>archive.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_uuencode.c"
                      ,L'\x15',0,"0",(long)wVar1,
                      "systemf(\"%s -cf - -Z --uuencode f >archive.out 2>archive.err\", testprog)",
                      (void *)0x0);
  pcVar2 = slurpfile(&s,"archive.out");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_uuencode.c"
                   ,L'\x18',(uint)(2 < s),"s > 2",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_uuencode.c"
                      ,L'\x19',pcVar2,"p","begin 644","\"begin 644\"",9,"9",(void *)0x0);
  free(pcVar2);
  wVar1 = systemf("%s -cf - --uuencode f >archive.out 2>archive.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_uuencode.c"
                      ,L'\x1f',0,"0",(long)wVar1,
                      "systemf(\"%s -cf - --uuencode f >archive.out 2>archive.err\", testprog)",
                      (void *)0x0);
  pcVar2 = slurpfile(&s,"archive.out");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_uuencode.c"
                   ,L'\"',(uint)(2 < s),"s > 2",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_uuencode.c"
                      ,L'#',pcVar2,"p","begin 644","\"begin 644\"",9,"9",(void *)0x0);
  free(pcVar2);
  return;
}

Assistant:

DEFINE_TEST(test_option_uuencode)
{
	char *p;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with compress compression and uuencode. */
	assertEqualInt(0,
	    systemf("%s -cf - -Z --uuencode f >archive.out 2>archive.err",
	    testprog));
	/* Check that the archive file has an uuencode signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "begin 644", 9);
	free(p);

	/* Archive it with uuencode only. */
	assertEqualInt(0,
	    systemf("%s -cf - --uuencode f >archive.out 2>archive.err",
	    testprog));
	/* Check that the archive file has an uuencode signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "begin 644", 9);
	free(p);
}